

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexBin.cpp
# Opt level: O0

XMLCh * xercesc_4_0::HexBin::getCanonicalRepresentation(XMLCh *hexData,MemoryManager *manager)

{
  int iVar1;
  XMLCh *retStr;
  MemoryManager *manager_local;
  XMLCh *hexData_local;
  
  iVar1 = getDataLength(hexData);
  if (iVar1 == -1) {
    hexData_local = (XMLCh *)0x0;
  }
  else {
    hexData_local = XMLString::replicate(hexData,manager);
    XMLString::upperCaseASCII(hexData_local);
  }
  return hexData_local;
}

Assistant:

XMLCh* HexBin::getCanonicalRepresentation(const XMLCh*          const hexData
                                        ,       MemoryManager*  const manager)
{

    if (getDataLength(hexData) == -1)
        return 0;

    XMLCh* retStr = XMLString::replicate(hexData, manager);
    XMLString::upperCaseASCII(retStr);

    return retStr;
}